

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Xdl.cpp
# Opt level: O0

String * __thiscall
asl::XdlEncoder::encode(String *__return_storage_ptr__,XdlEncoder *this,Var *v,Mode mode)

{
  char *local_50;
  char *local_48;
  Mode mode_local;
  Var *v_local;
  XdlEncoder *this_local;
  
  this->_pretty = (mode & PRETTY) != NONE;
  this->_json = (mode & JSON) != NONE;
  this->_simple = (mode & SIMPLE) != NONE;
  if ((this->_simple & 1U) == 0) {
    local_48 = "%.9g";
  }
  else {
    local_48 = "%.7g";
  }
  this->_fmtF = local_48;
  if ((this->_simple & 1U) == 0) {
    local_50 = "%.17g";
  }
  else {
    local_50 = "%.15g";
  }
  this->_fmtD = local_50;
  if ((mode & SHORTF) != NONE) {
    this->_fmtD = this->_fmtF;
  }
  if ((this->_pretty & 1U) != 0) {
    asl::String::operator=(&this->_sep1,", ");
  }
  if (((this->_json & 1U) == 0) && ((this->_pretty & 1U) != 0)) {
    asl::String::operator=(&this->_sep2,"");
  }
  reset(this);
  _encode(this,v);
  if ((this->_pretty & 1U) != 0) {
    asl::String::operator+=(&this->_out,'\n');
  }
  (*this->_sink->_vptr_XdlSink[2])();
  data(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

String XdlEncoder::encode(const Var& v, Json::Mode mode)
{
	_pretty = (mode & Json::PRETTY) != 0;
	_json = (mode & Json::JSON) != 0;
	_simple = (mode & Json::SIMPLE) != 0;
	_fmtF = _simple ? "%.7g" : "%.9g";
	_fmtD = _simple ? "%.15g" : "%.17g";
	if (mode & Json::SHORTF)
		_fmtD = _fmtF;
	if (_pretty)
		_sep1 = ", ";
	if (!_json && _pretty)
		_sep2 = "";
	reset();
	_encode(v);
	if (_pretty)
		_out += '\n';
	_sink->write(_out);
	return data();
}